

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void output_out_edges(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  char *pcVar1;
  char *pcVar2;
  out_edge_t local_20;
  edge_t_conflict e;
  bb_t_conflict bb_local;
  gen_ctx_t gen_ctx_local;
  
  fprintf((FILE *)gen_ctx->debug_file,"  out edges:");
  for (local_20 = DLIST_out_edge_t_head(&bb->out_edges); local_20 != (out_edge_t)0x0;
      local_20 = DLIST_out_edge_t_next(local_20)) {
    pcVar1 = "";
    if (local_20->fall_through_p != '\0') {
      pcVar1 = "f";
    }
    pcVar2 = "";
    if (local_20->back_edge_p != '\0') {
      pcVar2 = "*";
    }
    fprintf((FILE *)gen_ctx->debug_file," %3lu%s%s",local_20->dst->index,pcVar1,pcVar2);
  }
  fprintf((FILE *)gen_ctx->debug_file,"\n");
  return;
}

Assistant:

static void output_out_edges (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e;

  fprintf (debug_file, "  out edges:");
  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    fprintf (debug_file, " %3lu%s%s", (unsigned long) e->dst->index, e->fall_through_p ? "f" : "",
             e->back_edge_p ? "*" : "");
  }
  fprintf (debug_file, "\n");
}